

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroBranch
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  char *pcVar4;
  char *pcVar5;
  uint in_R8D;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  initializer_list<AssemblyTemplateArgument> variables;
  string op;
  string macroText;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  string local_168;
  char *local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  char *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  char *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  char *local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  char *local_a8;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  char *local_80;
  string local_78;
  char *local_58;
  string local_50;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  uVar3 = in_R8D & 7;
  bVar8 = (uVar3 - 3 & 0xfffffffd) == 0;
  local_188 = &local_178;
  local_180 = 0;
  local_178 = 0;
  if ((uVar3 == 6) || (uVar3 == 1)) {
    pcVar5 = "beq";
    if (uVar3 == 1) {
      pcVar5 = "bne";
    }
    pcVar4 = "beql";
    if (uVar3 == 1) {
      pcVar4 = "bnel";
    }
    if ((in_R8D >> 0x12 & 1) == 0) {
      pcVar4 = pcVar5;
    }
    std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,(ulong)pcVar4);
    pcVar5 = 
    "\n\t\t\t.if %imm% == 0\n\t\t\t\t%op%\t%rs%,r0,%dest%\n\t\t\t.else\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\t%op%\t%rs%,r1,%dest%\n\t\t\t.endif\n\t\t"
    ;
  }
  else {
    uVar3 = in_R8D & 6;
    if (((in_R8D >> 9 & 1) == 0) || ((uVar3 - 2 & 0xfffffffd) != 0)) {
      if ((uVar3 != 4) && (uVar3 != 2)) {
        (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                  )parser;
      }
      pcVar5 = "beqz";
      if (uVar3 == 2) {
        pcVar5 = "bnez";
      }
      pcVar4 = "beqzl";
      if (uVar3 == 2) {
        pcVar4 = "bnezl";
      }
      if ((in_R8D >> 0x12 & 1) == 0) {
        pcVar4 = pcVar5;
      }
      std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,(ulong)pcVar4);
      pcVar5 = 
      "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\tr1,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\tr1,%rs%,%rt%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
      ;
    }
    else {
      pcVar5 = "beqz";
      if (uVar3 == 2) {
        pcVar5 = "bnez";
      }
      pcVar4 = "beqzl";
      if (uVar3 == 2) {
        pcVar4 = "bnezl";
      }
      if ((in_R8D >> 0x12 & 1) == 0) {
        pcVar4 = pcVar5;
      }
      std::__cxx11::string::_M_replace((ulong)&local_188,0,(char *)0x0,(ulong)pcVar4);
      pcVar5 = 
      "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u% \tr1,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,r1,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\tr1,%imm%\n\t\t\t\tslt%u%\tr1,%rs%,r1\n\t\t\t.else\n\t\t\t\tslti%u%\tr1,%rs%,%imm%\n\t\t\t.endif\n\t\t\t%op%\tr1,%dest%\n\t\t"
      ;
    }
  }
  preprocessMacro_abi_cxx11_(&local_168,pcVar5,immediates_00);
  local_148 = "%op%";
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char*>((string *)local_140,local_188,local_188 + local_180);
  local_120 = "%u%";
  pcVar5 = " ";
  if (bVar8) {
    pcVar5 = "u";
  }
  local_118[0] = local_108;
  pcVar4 = "";
  if (bVar8) {
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,pcVar5,pcVar4);
  bVar8 = (in_R8D >> 0x13 & 1) == 0;
  local_f8 = "%revcmp%";
  pcVar5 = "1";
  if (bVar8) {
    pcVar5 = "0";
  }
  local_f0[0] = local_e0;
  pcVar4 = "";
  if (bVar8) {
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pcVar5,pcVar4);
  local_d0 = "%rs%";
  local_c8[0] = local_b8;
  peVar1 = (immediates->primary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,peVar1,
             (long)&((immediates->primary).expression.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_vptr__Sp_counted_base + (long)peVar1);
  local_a8 = "%rt%";
  local_a0[0] = local_90;
  p_Var2 = (immediates->secondary).expression.expression.
           super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,p_Var2,
             (long)&p_Var2->_vptr__Sp_counted_base +
             *(long *)&(immediates->secondary).expression.constExpression);
  local_80 = "%imm%";
  Expression::toString_abi_cxx11_(&local_78,&(immediates_00->primary).expression);
  local_58 = "%dest%";
  Expression::toString_abi_cxx11_(&local_50,&(immediates_00->secondary).expression);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_148;
  createMacro(parser,(string *)registers,(int)&local_168,variables);
  lVar6 = -0x118;
  paVar7 = &local_50.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -5);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroBranch(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool bne = type == MIPSM_NE;
	bool beq = type == MIPSM_EQ;
	bool beqz = type == MIPSM_GE || type == MIPSM_GEU;
	bool bnez = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool likely = (flags & MIPSM_LIKELY) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	std::string op;
	if (bne || beq)
	{
		const char* templateNeEq = R"(
			.if %imm% == 0
				%op%	%rs%,r0,%dest%
			.else
				li		r1,%imm%
				%op%	%rs%,r1,%dest%
			.endif
		)";

		selectedTemplate = templateNeEq;
		if(likely)
			op = bne ? "bnel" : "beql";
		else
			op = bne ? "bne" : "beq";
	} else if (immediate && (beqz || bnez))
	{
		const char* templateImmediate = R"(
			.if %revcmp% && %imm% == 0
				slt%u% 	r1,r0,%rs%
			.elseif %revcmp%
				li		r1,%imm%
				slt%u%	r1,r1,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		r1,%imm%
				slt%u%	r1,%rs%,r1
			.else
				slti%u%	r1,%rs%,%imm%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateImmediate;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else if (beqz || bnez)
	{
		const char* templateRegister = R"(
			.if %revcmp%
				slt%u%	r1,%rt%,%rs%
			.else
				slt%u%	r1,%rs%,%rt%
			.endif
			%op%	r1,%dest%
		)";

		selectedTemplate = templateRegister;
		if(likely)
			op = bnez ? "bnezl" : "beqzl";
		else
			op = bnez ? "bnez" : "beqz";
	} else {
		return nullptr;
	}
	
	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%op%",		op },
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%revcmp%",	revcmp ? "1" : "0"},
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.primary.expression.toString() },
			{ "%dest%",	immediates.secondary.expression.toString() },
	});
}